

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::MarshalAttribute
          (BP5Serializer *this,char *Name,DataType Type,size_t ElemSize,size_t ElemCount,void *Data)

{
  char *__ptr;
  FMFieldList *FieldP;
  BP5Serializer *this_00;
  char *in_RCX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  BP5Serializer *in_R9;
  int DataOffset_1;
  int CountOffset;
  char *ElemCountName;
  char *ArrayName;
  int DataOffset;
  char *SstName;
  void *DataAddress;
  char *AttrString;
  undefined4 in_stack_ffffffffffffff98;
  int iVar1;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  BP5Serializer *in_stack_ffffffffffffffa0;
  FMFieldList *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  ShapeID in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  BP5Serializer *this_01;
  BP5Serializer *FieldP_00;
  
  *(undefined1 *)(in_RDI + 0x118) = 1;
  this_01 = in_R9;
  FieldP_00 = (BP5Serializer *)0x0;
  if (in_EDX == 0xe) {
    in_RCX = (char *)0x8;
    this_01 = (BP5Serializer *)&stack0xffffffffffffffc8;
    FieldP_00 = in_R9;
  }
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_R8 == -1) {
    __ptr = BuildVarName(this_01,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0,iVar2);
    AddField((BP5Serializer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (DataType)((ulong)in_RDI >> 0x20),(int)in_RDI);
    free(__ptr);
    RecalcAttributeStorageSize(in_stack_ffffffffffffffa0);
    memcpy((void *)(*(long *)(in_RDI + 200) +
                   (long)*(int *)(*(long *)(in_RDI + 0xb8) +
                                  (long)(*(int *)(in_RDI + 0xb0) + -1) * 0x18 + 0x14)),this_01,
           (size_t)in_RCX);
  }
  else {
    FieldP = (FMFieldList *)
             BuildVarName(this_01,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          in_stack_ffffffffffffffb0,iVar2);
    this_00 = (BP5Serializer *)
              ConcatName((char *)in_stack_ffffffffffffffa0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    AddField((BP5Serializer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),FieldP,
             (int *)this_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (DataType)((ulong)in_RDI >> 0x20),(int)in_RDI);
    iVar2 = *(int *)(*(long *)(in_RDI + 0xb8) + (long)(*(int *)(in_RDI + 0xb0) + -1) * 0x18 + 0x14);
    AddVarArrayField(in_R9,(FMFieldList *)FieldP_00,(int *)this_01,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_RCX);
    iVar1 = *(int *)(*(long *)(in_RDI + 0xb8) + (long)(*(int *)(in_RDI + 0xb0) + -1) * 0x18 + 0x14);
    free(this_00);
    free(FieldP);
    RecalcAttributeStorageSize(this_00);
    *(long *)(*(long *)(in_RDI + 200) + (long)iVar2) = in_R8;
    *(BP5Serializer **)(*(long *)(in_RDI + 200) + (long)iVar1) = in_R9;
  }
  return;
}

Assistant:

void BP5Serializer::MarshalAttribute(const char *Name, const DataType Type, size_t ElemSize,
                                     size_t ElemCount, const void *Data)
{

    const char *AttrString = NULL;
    const void *DataAddress = Data;

    NewAttribute = true;
    if (Type == DataType::String)
    {
        ElemSize = sizeof(char *);
        AttrString = (char *)Data;
        DataAddress = (const char *)&AttrString;
    }
    if (ElemCount == (size_t)(-1))
    {
        // simple field, only simple attribute name and value
        char *SstName = BuildVarName(Name, ShapeID::GlobalValue, (int)Type, (int)ElemSize);
        AddField(&Info.AttributeFields, &Info.AttributeFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcAttributeStorageSize();
        int DataOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        memcpy((char *)(Info.AttributeData) + DataOffset, DataAddress, ElemSize);
    }
    else
    {
        // Array field.  To attribute data add dimension field and dynamic array
        // field
        char *ArrayName = BuildVarName(Name, ShapeID::GlobalArray, 0,
                                       0); // size and type in full field spec
        char *ElemCountName = ConcatName(ArrayName, "ElemCount");
        AddField(&Info.AttributeFields, &Info.AttributeFieldCount, ElemCountName, DataType::Int64,
                 sizeof(int64_t));
        int CountOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        AddVarArrayField(&Info.AttributeFields, &Info.AttributeFieldCount, ArrayName, Type,
                         (int)ElemSize, ElemCountName);
        int DataOffset = Info.AttributeFields[Info.AttributeFieldCount - 1].field_offset;
        free(ElemCountName);
        free(ArrayName);

        RecalcAttributeStorageSize();

        memcpy((char *)(Info.AttributeData) + CountOffset, &ElemCount, sizeof(size_t));
        memcpy((char *)(Info.AttributeData) + DataOffset, &Data, sizeof(void *));
    }
}